

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.h
# Opt level: O1

Box * __thiscall
libDAI::Box::boundSumProd
          (Box *__return_storage_ptr__,Box *this,Factor *psi,VarSet *dest,bool normed)

{
  Box *pBVar1;
  long lVar2;
  ulong uVar3;
  Prob image_ep;
  Prob image_max;
  Prob image_min;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> ep;
  TProb<double> local_158;
  VarSet *local_140;
  TFactor<double> local_138;
  TProb<double> local_100;
  TProb<double> local_e8;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> local_d0;
  Box *local_b8;
  Factor *local_b0;
  Box *local_a8;
  TFactor<double> local_a0;
  TFactor<double> local_68;
  
  local_b0 = psi;
  local_a8 = this;
  extremePoints(&local_d0,this);
  local_138._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x7ff0000000000000;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_e8._p,dest->_statespace,(value_type_conflict3 *)&local_138,
             (allocator_type *)&local_a0);
  local_138._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xfff0000000000000;
  local_140 = dest;
  local_b8 = __return_storage_ptr__;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_100._p,dest->_statespace,(value_type_conflict3 *)&local_138,
             (allocator_type *)&local_a0);
  if (local_d0.super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_d0.super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      TFactor<double>::TFactor
                (&local_68,&local_a8->_vars,
                 (TProb<double> *)
                 ((long)&((local_d0.
                           super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_p).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar2));
      TFactor<double>::operator*(&local_a0,local_b0,&local_68);
      TFactor<double>::marginal(&local_138,&local_a0,local_140,normed);
      std::vector<double,_std::allocator<double>_>::operator=(&local_158._p,&local_138._p._p);
      if (local_138._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_138._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_138._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_138._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_138._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_138._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_138._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_138._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a0._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      min<double>((TProb<double> *)&local_138,&local_158,&local_e8);
      std::vector<double,_std::allocator<double>_>::operator=
                (&local_e8._p,(vector<double,_std::allocator<double>_> *)&local_138);
      if (local_138._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_138._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_138._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_138._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      max<double>((TProb<double> *)&local_138,&local_158,&local_100);
      std::vector<double,_std::allocator<double>_>::operator=
                (&local_100._p,(vector<double,_std::allocator<double>_> *)&local_138);
      if (local_138._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_138._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_138._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_138._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_158._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_158._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_158._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x18;
    } while (uVar3 < (ulong)(((long)local_d0.
                                    super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_d0.
                                    super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  pBVar1 = local_b8;
  Box(local_b8,local_140,&local_e8,&local_100);
  if (local_100._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_100._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::~vector(&local_d0);
  return pBVar1;
}

Assistant:

Box boundSumProd(Factor psi, VarSet dest, bool normed) const {
                // FIXME: do we have to store the extreme points?
                std::vector<Prob> ep = extremePoints();
                Prob image_min( dest.stateSpace(), INFINITY );
                Prob image_max( dest.stateSpace(), -INFINITY );
                for( size_t l = 0; l < ep.size(); l++ ) {
                    // FIXME: this can be sped up massively by caching the index
                    Prob image_ep;
                    image_ep = (psi * Factor(_vars,ep[l])).marginal(dest,normed).p();
                    image_min = libDAI::min( image_ep, image_min );
                    image_max = libDAI::max( image_ep, image_max );
                }
                return Box( dest, image_min, image_max );
            }